

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemapping.cpp
# Opt level: O1

bool __thiscall
myutils::FileMapping::create_file(FileMapping *this,string *filename,uint32_t filesize)

{
  int __fd;
  void *__buf;
  char *pcVar1;
  ulong __n;
  
  std::__cxx11::string::_M_assign((string *)&this->m_id);
  if (filename->_M_string_length == 0) {
    pcVar1 = (char *)mmap((void *)0x0,(ulong)filesize,3,0x21,0,0);
    if (pcVar1 == (char *)0xffffffffffffffff) {
      return pcVar1 != (char *)0xffffffffffffffff;
    }
    this->m_pMapAddress = pcVar1;
    this->m_fd = -1;
  }
  else {
    __fd = open((filename->_M_dataplus)._M_p,0x42,0x1c0);
    if (__fd == -1) {
      return false;
    }
    fchmod(__fd,0x180);
    __n = (ulong)filesize;
    __buf = operator_new__(__n);
    write(__fd,__buf,__n);
    operator_delete__(__buf);
    pcVar1 = (char *)mmap((void *)0x0,__n,3,1,__fd,0);
    if (pcVar1 == (char *)0xffffffffffffffff) {
      ::close(__fd);
      return false;
    }
    this->m_pMapAddress = pcVar1;
    this->m_fd = __fd;
  }
  this->m_filesize = filesize;
  return true;
}

Assistant:

bool FileMapping::create_file(const string& filename, uint32_t filesize)
{
    m_id = filename;    

    if (!filename.empty()) {
        int fd = ::open(filename.c_str(), O_CREAT | O_RDWR, S_IRWXU);
        if ( fd == -1) {
            //VLOG(1) <<"Can't create " << filename <<", error=" << strerror(errno);
            return false;
        }

        fchmod(fd, S_IRUSR | S_IWUSR);
        
        char* buf = new char[filesize];
        write(fd, buf, filesize);
        delete[] buf;
        
        char* p = (char*)mmap(nullptr, filesize, PROT_READ|PROT_WRITE, MAP_SHARED, fd, 0);
        if (p != MAP_FAILED) {
            m_pMapAddress = p;
            m_fd = fd;
            m_filesize = filesize;

            return true;
        } else {
            ::close(fd);
            return false;
        }
    }
    else {
        char* p = (char*)mmap(nullptr, filesize, PROT_READ|PROT_WRITE, MAP_SHARED | MAP_ANON, 0, 0);        
        if (p != MAP_FAILED) {
            m_pMapAddress = p;
            m_fd = -1;
            m_filesize = filesize;

            return true;
        } else {
            return false;
        }
    }

}